

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gls::StateChangePerformanceCase::iterate(StateChangePerformanceCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  MessageBuilder *pMVar4;
  size_type sVar5;
  size_type sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  value_type_conflict9 local_370;
  deUint64 local_368;
  deUint64 refEndUs;
  deUint64 refBeginUs;
  Functions *gl_1;
  deUint64 local_348;
  deUint64 resEndUs;
  deUint64 resBeginUs;
  Functions *gl;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  StateChangePerformanceCase *this_local;
  
  log = (TestLog *)this;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (&this->m_interleavedResults);
  if ((bVar1) &&
     (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (&this->m_batchedResults), bVar1)) {
    local_20 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [18])"Draw call count: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_callCount);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&gl,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&gl,(char (*) [26])"Per call triangle count: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_triangleCount);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl);
  }
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (&this->m_interleavedResults);
  if ((int)sVar5 < this->m_iterationCount) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&this->m_batchedResults);
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&this->m_interleavedResults);
    if (sVar6 <= sVar5) {
      iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      resBeginUs = CONCAT44(extraout_var,iVar2);
      resEndUs = 0;
      local_348 = 0;
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,resBeginUs);
      (**(code **)(resBeginUs + 0x648))();
      dVar3 = (**(code **)(resBeginUs + 0x800))();
      glu::checkError(dVar3,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x247);
      resEndUs = deGetMicroseconds();
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])(this,resBeginUs);
      (**(code **)(resBeginUs + 0x648))();
      local_348 = deGetMicroseconds();
      dVar3 = (**(code **)(resBeginUs + 0x800))();
      glu::checkError(dVar3,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x250);
      gl_1 = (Functions *)(local_348 - resEndUs);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_interleavedResults,(value_type_conflict9 *)&gl_1);
      return CONTINUE;
    }
  }
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_batchedResults);
  bVar1 = this->m_iterationCount <= (int)sVar5;
  if (bVar1) {
    logAndSetTestResult(this);
  }
  else {
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    refBeginUs = CONCAT44(extraout_var_00,iVar2);
    refEndUs = 0;
    local_368 = 0;
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,refBeginUs);
    (**(code **)(refBeginUs + 0x648))();
    dVar3 = (**(code **)(refBeginUs + 0x800))();
    glu::checkError(dVar3,"glFinish()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                    ,0x25e);
    refEndUs = deGetMicroseconds();
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(this,refBeginUs);
    (**(code **)(refBeginUs + 0x648))();
    local_368 = deGetMicroseconds();
    dVar3 = (**(code **)(refBeginUs + 0x800))();
    glu::checkError(dVar3,"glFinish()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                    ,0x267);
    local_370 = local_368 - refEndUs;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->m_batchedResults,&local_370);
  }
  this_local._4_4_ = (IterateResult)!bVar1;
  return this_local._4_4_;
}

Assistant:

tcu::TestCase::IterateResult StateChangePerformanceCase::iterate (void)
{
	if (m_interleavedResults.empty() && m_batchedResults.empty())
	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "Draw call count: " << m_callCount << TestLog::EndMessage;
		log << TestLog::Message << "Per call triangle count: " << m_triangleCount << TestLog::EndMessage;
	}

	// \note [mika] Interleave sampling to balance effects of powerstate etc.
	if ((int)m_interleavedResults.size() < m_iterationCount && m_batchedResults.size() >= m_interleavedResults.size())
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deUint64				resBeginUs	= 0;
		deUint64				resEndUs	= 0;

		setupInitialState(gl);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		// Render result
		resBeginUs = deGetMicroseconds();

		renderTest(gl);

		gl.finish();
		resEndUs = deGetMicroseconds();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		m_interleavedResults.push_back(resEndUs - resBeginUs);

		return CONTINUE;
	}
	else if ((int)m_batchedResults.size() < m_iterationCount)
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deUint64				refBeginUs	= 0;
		deUint64				refEndUs	= 0;

		setupInitialState(gl);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		// Render reference
		refBeginUs = deGetMicroseconds();

		renderReference(gl);

		gl.finish();
		refEndUs = deGetMicroseconds();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		m_batchedResults.push_back(refEndUs - refBeginUs);

		return CONTINUE;
	}
	else
	{
		logAndSetTestResult();
		return STOP;
	}
}